

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
despot::Parser::PrintState(Parser *this,vector<int,_std::allocator<int>_> *state,ostream *out)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  ostream *poVar4;
  reference pvVar5;
  string *psVar6;
  const_reference pvVar7;
  char *pcVar8;
  int local_24;
  int s;
  ostream *out_local;
  vector<int,_std::allocator<int>_> *state_local;
  Parser *this_local;
  
  std::operator<<(out,"[");
  local_24 = 0;
  while( true ) {
    sVar3 = std::vector<int,_std::allocator<int>_>::size(state);
    if (sVar3 <= (ulong)(long)local_24) break;
    pcVar8 = ", ";
    if (local_24 == 0) {
      pcVar8 = "";
    }
    poVar4 = std::operator<<(out,pcVar8);
    pvVar5 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::operator[]
                       (&this->curr_state_vars_,(long)local_24);
    psVar6 = NamedVar::name_abi_cxx11_(&pvVar5->super_NamedVar);
    poVar4 = std::operator<<(poVar4,(string *)psVar6);
    std::operator<<(poVar4,":");
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](state,(long)local_24);
    iVar1 = *pvVar7;
    pvVar5 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::operator[]
                       (&this->curr_state_vars_,(long)local_24);
    iVar2 = Variable::Size((Variable *)pvVar5);
    if (iVar1 < iVar2) {
      pvVar5 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::operator[]
                         (&this->curr_state_vars_,(long)local_24);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](state,(long)local_24);
      psVar6 = Variable::GetValue_abi_cxx11_((Variable *)pvVar5,*pvVar7);
      std::operator<<(out,(string *)psVar6);
    }
    else {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](state,(long)local_24);
      std::ostream::operator<<(out,*pvVar7);
    }
    local_24 = local_24 + 1;
  }
  poVar4 = std::operator<<(out,"]");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Parser::PrintState(const vector<int>& state, ostream& out) const {
	out << "[";
	for (int s = 0; s < state.size(); s++) {
		out << (s == 0 ? "" : ", ") << curr_state_vars_[s].name() << ":";
		if (state[s] >= curr_state_vars_[s].Size()) {
			// allow POMDPX::current_->PrintState to work in POMDPXState::text when 
			// state is not defined in current_, but the names of the state
			// components are defined
			out << state[s];
		} else {
			out << curr_state_vars_[s].GetValue(state[s]);
		}
	}
	out << "]" << endl;
}